

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fNegativeShaderFunctionTests.cpp
# Opt level: O2

void deqp::gles31::Functional::NegativeTestShared::anon_unknown_0::atomic_and
               (NegativeTestContext *ctx)

{
  ShaderType shaderType;
  bool bVar1;
  char *__s;
  long lVar2;
  DataType in_stack_ffffffffffffff48;
  allocator<char> local_b1;
  string shaderSource;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  string local_70;
  string local_50;
  
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&shaderSource,"atomicAnd",(allocator<char> *)&local_90);
  NegativeTestContext::beginSection(ctx,&shaderSource);
  std::__cxx11::string::~string((string *)&shaderSource);
  for (lVar2 = 0; lVar2 != 0x18; lVar2 = lVar2 + 4) {
    shaderType = *(ShaderType *)
                  ((long)&NegativeTestShared::(anonymous_namespace)::s_shaders + lVar2);
    bVar1 = NegativeTestContext::isShaderSupported(ctx,shaderType);
    if (bVar1) {
      __s = glu::getShaderTypeName(shaderType);
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_90,__s,&local_b1);
      std::operator+(&shaderSource,"Verify shader: ",&local_90);
      NegativeTestContext::beginSection(ctx,&shaderSource);
      std::__cxx11::string::~string((string *)&shaderSource);
      std::__cxx11::string::~string((string *)&local_90);
      NegativeTestShared::(anonymous_namespace)::genShaderSourceAtomicOperations_abi_cxx11_
                (&shaderSource,(_anonymous_namespace_ *)ctx,(NegativeTestContext *)(ulong)shaderType
                 ,0x13,SHADER_FUNCTION_INTERPOLATED_AT_CENTROID|SHADER_FUNCTION_IMUL_EXTENDED,
                 TYPE_INT,in_stack_ffffffffffffff48);
      std::__cxx11::string::string((string *)&local_50,(string *)&shaderSource);
      verifyShader(ctx,shaderType,&local_50);
      std::__cxx11::string::~string((string *)&local_50);
      std::__cxx11::string::~string((string *)&shaderSource);
      NegativeTestShared::(anonymous_namespace)::genShaderSourceAtomicOperations_abi_cxx11_
                (&shaderSource,(_anonymous_namespace_ *)ctx,(NegativeTestContext *)(ulong)shaderType
                 ,0x13,SHADER_FUNCTION_LAST,TYPE_UINT,in_stack_ffffffffffffff48);
      std::__cxx11::string::string((string *)&local_70,(string *)&shaderSource);
      verifyShader(ctx,shaderType,&local_70);
      std::__cxx11::string::~string((string *)&local_70);
      std::__cxx11::string::~string((string *)&shaderSource);
      NegativeTestContext::endSection(ctx);
    }
  }
  NegativeTestContext::endSection(ctx);
  return;
}

Assistant:

void atomic_and (NegativeTestContext& ctx)
{
	ctx.beginSection("atomicAnd");
	for (int shaderNdx = 0; shaderNdx < DE_LENGTH_OF_ARRAY(s_shaders); ++shaderNdx)
	{
		if (ctx.isShaderSupported(s_shaders[shaderNdx]))
		{
			ctx.beginSection("Verify shader: " + std::string(getShaderTypeName(s_shaders[shaderNdx])));
			{
				const std::string shaderSource(genShaderSourceAtomicOperations(ctx, s_shaders[shaderNdx], SHADER_FUNCTION_ATOMIC_AND, glu::TYPE_UINT, glu::TYPE_INT));
				verifyShader(ctx, s_shaders[shaderNdx], shaderSource);
			}
			{
				const std::string shaderSource(genShaderSourceAtomicOperations(ctx, s_shaders[shaderNdx], SHADER_FUNCTION_ATOMIC_AND, glu::TYPE_INT, glu::TYPE_UINT));
				verifyShader(ctx, s_shaders[shaderNdx], shaderSource);
			}
			ctx.endSection();
		}
	}
	ctx.endSection();
}